

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv__async_start(uv_loop_t *loop)

{
  int iVar1;
  int *piVar2;
  int pipefd [2];
  char buf [32];
  
  if ((loop->async_io_watcher).fd != -1) {
    return 0;
  }
  if (uv__async_eventfd_no_eventfd2 == '\0') {
    iVar1 = uv__eventfd2(0,0x80800);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 == 0x26) {
        uv__async_eventfd_no_eventfd2 = '\x01';
        goto LAB_004433dd;
      }
LAB_0044344b:
      iVar1 = -iVar1;
    }
LAB_0044344d:
    if (-1 < iVar1) {
      pipefd[1] = -1;
      pipefd[0] = iVar1;
      goto LAB_004434c6;
    }
    if (iVar1 != -0x26) {
      return iVar1;
    }
  }
  else {
LAB_004433dd:
    if (uv__async_eventfd_no_eventfd == '\0') {
      iVar1 = uv__eventfd(0);
      if (iVar1 != -1) {
        uv__cloexec_ioctl(iVar1,1);
        uv__nonblock_ioctl(iVar1,1);
        goto LAB_0044344d;
      }
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 != 0x26) goto LAB_0044344b;
      uv__async_eventfd_no_eventfd = '\x01';
    }
  }
  iVar1 = uv__make_pipe(pipefd,0x800);
  if (iVar1 == 0) {
    snprintf(buf,0x20,"/proc/self/fd/%d",(ulong)(uint)pipefd[0]);
    iVar1 = uv__open_cloexec(buf,2);
    if (-1 < iVar1) {
      uv__close(pipefd[0]);
      uv__close(pipefd[1]);
      pipefd[0] = iVar1;
      pipefd[1] = iVar1;
    }
  }
  else if (iVar1 < 0) {
    return iVar1;
  }
LAB_004434c6:
  uv__io_init(&loop->async_io_watcher,uv__async_io,pipefd[0]);
  uv__io_start(loop,&loop->async_io_watcher,1);
  loop->async_wfd = pipefd[1];
  return 0;
}

Assistant:

static int uv__async_start(uv_loop_t* loop) {
  int pipefd[2];
  int err;

  if (loop->async_io_watcher.fd != -1)
    return 0;

  err = uv__async_eventfd();
  if (err >= 0) {
    pipefd[0] = err;
    pipefd[1] = -1;
  }
  else if (err == UV_ENOSYS) {
    err = uv__make_pipe(pipefd, UV__F_NONBLOCK);
#if defined(__linux__)
    /* Save a file descriptor by opening one of the pipe descriptors as
     * read/write through the procfs.  That file descriptor can then
     * function as both ends of the pipe.
     */
    if (err == 0) {
      char buf[32];
      int fd;

      snprintf(buf, sizeof(buf), "/proc/self/fd/%d", pipefd[0]);
      fd = uv__open_cloexec(buf, O_RDWR);
      if (fd >= 0) {
        uv__close(pipefd[0]);
        uv__close(pipefd[1]);
        pipefd[0] = fd;
        pipefd[1] = fd;
      }
    }
#endif
  }

  if (err < 0)
    return err;

  uv__io_init(&loop->async_io_watcher, uv__async_io, pipefd[0]);
  uv__io_start(loop, &loop->async_io_watcher, POLLIN);
  loop->async_wfd = pipefd[1];

  return 0;
}